

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.h
# Opt level: O3

void __thiscall
slang::ast::RangeSelectExpression::visitExprs<slang::analysis::SampledValueFuncVisitor&>
          (RangeSelectExpression *this,SampledValueFuncVisitor *visitor)

{
  Expression::
  visitExpression<slang::ast::Expression_const,slang::analysis::SampledValueFuncVisitor&>
            (this->value_,this->value_,visitor);
  Expression::
  visitExpression<slang::ast::Expression_const,slang::analysis::SampledValueFuncVisitor&>
            (this->left_,this->left_,visitor);
  Expression::
  visitExpression<slang::ast::Expression_const,slang::analysis::SampledValueFuncVisitor&>
            (this->right_,this->right_,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        value().visit(visitor);
        left().visit(visitor);
        right().visit(visitor);
    }